

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_bool nk_contextual_item_image_text
                  (nk_context *ctx,nk_image img,char *text,int len,nk_flags align)

{
  byte *pbVar1;
  nk_window *pnVar2;
  nk_widget_layout_states nVar3;
  nk_bool nVar4;
  nk_window *popup;
  nk_context *in;
  nk_rect bounds;
  nk_rect local_40;
  
  nVar3 = NK_WIDGET_INVALID;
  if (((ctx != (nk_context *)0x0) &&
      (pnVar2 = ctx->current, nVar3 = NK_WIDGET_INVALID, pnVar2 != (nk_window *)0x0)) &&
     (pnVar2->layout != (nk_panel *)0x0)) {
    nVar3 = nk_widget(&local_40,ctx);
    if (nVar3 != NK_WIDGET_INVALID) {
      if (nVar3 == NK_WIDGET_ROM) {
        in = (nk_context *)0x0;
      }
      else {
        in = (nk_context *)0x0;
        if ((pnVar2->layout->flags & 0x1000) == 0) {
          in = ctx;
        }
      }
      nVar3 = NK_WIDGET_INVALID;
      nVar4 = nk_do_button_text_image
                        (&ctx->last_widget_state,&pnVar2->buffer,local_40,img,text,len,align,
                         NK_BUTTON_DEFAULT,&(ctx->style).contextual_button,(ctx->style).font,
                         &in->input);
      if (nVar4 != 0) {
        pnVar2 = ctx->current;
        nVar3 = NK_WIDGET_VALID;
        if ((pnVar2 != (nk_window *)0x0) && (pnVar2->layout != (nk_panel *)0x0)) {
          pbVar1 = (byte *)((long)&pnVar2->flags + 1);
          *pbVar1 = *pbVar1 | 0x20;
        }
      }
    }
  }
  return nVar3;
}

Assistant:

NK_API nk_bool
nk_contextual_item_image_text(struct nk_context *ctx, struct nk_image img,
const char *text, int len, nk_flags align)
{
struct nk_window *win;
const struct nk_input *in;
const struct nk_style *style;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
state = nk_widget_fitting(&bounds, ctx, style->contextual_button.padding);
if (!state) return nk_false;

in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
if (nk_do_button_text_image(&ctx->last_widget_state, &win->buffer, bounds,
img, text, len, align, NK_BUTTON_DEFAULT, &style->contextual_button, style->font, in)){
nk_contextual_close(ctx);
return nk_true;
}
return nk_false;
}